

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

void __thiscall
qpdf::Stream::replaceStreamData
          (Stream *this,shared_ptr<Buffer> *data,QPDFObjectHandle *filter,
          QPDFObjectHandle *decode_parms)

{
  Members *pMVar1;
  size_t length;
  __shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  pMVar1 = stream(this);
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pMVar1->stream_data).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,
             &data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pMVar1->stream_provider).
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>,
             &local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  length = Buffer::getSize((data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  replaceFilterData(this,filter,decode_parms,length);
  return;
}

Assistant:

void
Stream::replaceStreamData(
    std::shared_ptr<Buffer> data,
    QPDFObjectHandle const& filter,
    QPDFObjectHandle const& decode_parms)
{
    auto s = stream();
    s->stream_data = data;
    s->stream_provider = nullptr;
    replaceFilterData(filter, decode_parms, data->getSize());
}